

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconengine.cpp
# Opt level: O1

QPixmap * __thiscall
QIconEngine::scaledPixmap
          (QPixmap *__return_storage_ptr__,QIconEngine *this,QSize *size,Mode mode,State state,
          qreal scale)

{
  long in_FS_OFFSET;
  QSize local_68;
  undefined8 uStack_60;
  qreal local_58;
  undefined1 local_50 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = -NAN;
  local_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
  local_68.wd.m_i = -1;
  local_68.ht.m_i = -1;
  QPixmap::QPixmap((QPixmap *)local_50);
  local_68 = *size;
  uStack_60 = (undefined1 *)CONCAT44(state,mode);
  local_58 = scale;
  (*this->_vptr_QIconEngine[0xf])(this,4,&local_68);
  QPixmap::QPixmap(__return_storage_ptr__,(QPixmap *)local_50);
  QPixmap::~QPixmap((QPixmap *)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QIconEngine::scaledPixmap(const QSize &size, QIcon::Mode mode, QIcon::State state, qreal scale)
{
    ScaledPixmapArgument arg;
    arg.size = size;
    arg.mode = mode;
    arg.state = state;
    arg.scale = scale;
    const_cast<QIconEngine *>(this)->virtual_hook(QIconEngine::ScaledPixmapHook, reinterpret_cast<void*>(&arg));
    return arg.pixmap;
}